

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O2

void __thiscall
HistogramBasedDistribution::estimateGaussian
          (HistogramBasedDistribution *this,double *mean,double *stddev)

{
  pointer ppVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  ppVar1 = (this->values).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(this->values).
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4;
  dVar5 = 0.0;
  uVar3 = 1;
  dVar6 = 0.0;
  dVar7 = 0.0;
  dVar12 = 0.0;
  do {
    dVar11 = dVar12;
    if (uVar3 - uVar2 == 1) goto LAB_00193104;
    iVar4 = this->max;
    if (uVar3 < uVar2) {
      iVar4 = ppVar1[1].first + -1;
    }
    dVar9 = (double)((iVar4 - ppVar1->first) + 1);
    dVar8 = ppVar1->second * dVar9;
    dVar12 = dVar11 + dVar8;
    dVar10 = (double)ppVar1->first;
    if (0.25 <= dVar12) {
      dVar7 = ((0.25 - dVar11) * dVar9) / dVar8 + dVar10;
    }
    if (0.5 <= dVar12) {
      dVar6 = ((0.5 - dVar11) * dVar9) / dVar8 + dVar10;
    }
    uVar3 = uVar3 + 1;
    ppVar1 = ppVar1 + 1;
  } while (dVar12 < 0.75);
  dVar5 = ((0.75 - dVar11) * dVar9) / dVar8 + dVar10;
LAB_00193104:
  *mean = dVar6;
  *stddev = ((dVar5 - dVar7) * 0.5) / 0.6744898;
  return;
}

Assistant:

void HistogramBasedDistribution::estimateGaussian(double* mean, double* stddev) {
	double p_sum = 0.0;
	double q25 = 0;
	bool q25_set = false;
	double q50 = 0;
	bool q50_set = false;
	double q75 = 0;
	for (size_t i=0; i<values.size(); ++i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (!q25_set && (p_sum + p >= 0.25)) {
			q25 = start + ((double)length)*(0.25-p_sum)/p;
		}
		if (!q50_set && (p_sum + p >= 0.5)) {
			q50 = start + ((double)length)*(0.5-p_sum)/p;
		}
		if (p_sum + p >= 0.75) {
			q75 = start + ((double)length)*(0.75-p_sum)/p;
			break;
		}
		p_sum += p;
	}
	*mean = q50;
	*stddev = (q75 - q25) / 2 / 0.6744898;
}